

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfCase.cpp
# Opt level: O3

IfCase * __thiscall ninx::parser::element::IfCase::clone_impl(IfCase *this)

{
  IfCase *pIVar1;
  Expression *local_20;
  Block *local_18;
  
  pIVar1 = (IfCase *)operator_new(0x28);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_20);
  ASTElement::clone<ninx::parser::element::Block>((ASTElement *)&local_18);
  (pIVar1->super_ASTElement).parent = (Block *)0x0;
  (pIVar1->super_ASTElement).__output_block = (Block *)0x0;
  (pIVar1->super_ASTElement)._vptr_ASTElement = (_func_int **)&PTR__IfCase_001507b0;
  (pIVar1->condition)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl = local_20;
  (pIVar1->body)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = local_18;
  return pIVar1;
}

Assistant:

ninx::parser::element::IfCase *ninx::parser::element::IfCase::clone_impl() {
    return new IfCase(this->condition->clone<Expression>(), this->body->clone<Block>());
}